

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_store.cxx
# Opt level: O2

void test_log_store_pack(void)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  EVP_PKEY_CTX *ctx;
  fs_log_store *pfVar4;
  uint uVar5;
  bool bVar6;
  ptr<log_entry> entry;
  ptr<log_entry> entry2;
  _Any_data local_2118;
  code *local_2108;
  code *local_2100;
  fs_log_store store1;
  fs_log_store store;
  random_device rd;
  
  pfVar4 = (fs_log_store *)&entry;
  ctx = (EVP_PKEY_CTX *)&rd;
  std::random_device::random_device((random_device *)ctx);
  uVar2 = std::random_device::_M_getval();
  iVar1 = (int)((uVar2 & 0xffffffff) % 0x7fffffff);
  local_2118._8_8_ = ZEXT48(iVar1 + (uint)(iVar1 == 0));
  local_2118._M_unused._M_object = (void *)0x271000000001;
  local_2100 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/tests/src/test_log_store.cxx:222:34)>
               ::_M_invoke;
  local_2108 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/tests/src/test_log_store.cxx:222:34)>
               ::_M_manager;
  cleanup(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&store,"tmp",(allocator<char> *)&store1);
  cleanup((EVP_PKEY_CTX *)&store);
  std::__cxx11::string::~string((string *)&store);
  mkdir("tmp",0x1f6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&store1,".",(allocator<char> *)&entry);
  cornerstone::fs_log_store::fs_log_store(&store,(string *)&store1,1000);
  std::__cxx11::string::~string((string *)&store1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&entry,"tmp",(allocator<char> *)&entry2);
  cornerstone::fs_log_store::fs_log_store(&store1,(string *)&entry,1000);
  std::__cxx11::string::~string((string *)&entry);
  iVar1 = std::function<int_()>::operator()((function<int_()> *)&local_2118);
  uVar5 = iVar1 % 1000 + 1000;
  uVar3 = uVar5;
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    rnd_entry((function<int_()> *)&entry);
    cornerstone::fs_log_store::append(&store,&entry);
    rnd_entry((function<int_()> *)&entry2);
    std::__shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2> *)&entry2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry2.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pfVar4 = (fs_log_store *)&entry;
    cornerstone::fs_log_store::append(&store1,&entry);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  uVar3 = 0;
  while ((int)uVar3 < (int)uVar5) {
    pfVar4 = (fs_log_store *)(long)(int)(uVar3 + 1);
    cornerstone::fs_log_store::pack((fs_log_store *)&entry,(ulong)&store,uVar3 + 1);
    cornerstone::fs_log_store::apply_pack
              (&store1,(ulong)pfVar4,
               (buffer *)
               entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    uVar3 = uVar3 + 100;
    if ((int)uVar5 < (int)uVar3) {
      uVar3 = uVar5;
    }
    std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
              ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)&entry);
  }
  for (uVar2 = 1; iVar1 = (int)pfVar4, uVar2 <= uVar5; uVar2 = uVar2 + 1) {
    cornerstone::fs_log_store::entry_at((fs_log_store *)&entry,(ulong)&store);
    pfVar4 = &store1;
    cornerstone::fs_log_store::entry_at((fs_log_store *)&entry2,(ulong)&store1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry2.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  cornerstone::fs_log_store::close(&store,iVar1);
  pfVar4 = &store1;
  cornerstone::fs_log_store::close(pfVar4,iVar1);
  cleanup((EVP_PKEY_CTX *)pfVar4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&entry,"tmp",(allocator<char> *)&entry2);
  cleanup((EVP_PKEY_CTX *)&entry);
  std::__cxx11::string::~string((string *)&entry);
  rmdir("tmp");
  cornerstone::fs_log_store::~fs_log_store(&store1);
  cornerstone::fs_log_store::~fs_log_store(&store);
  std::_Function_base::~_Function_base((_Function_base *)&local_2118);
  std::random_device::~random_device(&rd);
  return;
}

Assistant:

void test_log_store_pack()
{
    std::random_device rd;
    std::default_random_engine engine(rd());
    std::uniform_int_distribution<int32> distribution(1, 10000);
    std::function<int32()> rnd = [distribution, engine]() mutable -> int32_t { return distribution(engine); };

    cleanup();
    cleanup("tmp");
    mkdir("tmp", 0766);
    fs_log_store store(".", 1000);
    fs_log_store store1("tmp", 1000);
    int logs_cnt = rnd() % 1000 + 1000;
    for (int i = 0; i < logs_cnt; ++i)
    {
        ptr<log_entry> entry = rnd_entry(rnd);
        store.append(entry);
        entry = rnd_entry(rnd);
        store1.append(entry);
    }

    int logs_copied = 0;
    while (logs_copied < logs_cnt)
    {
        bufptr pack = store.pack(logs_copied + 1, 100);
        store1.apply_pack(logs_copied + 1, *pack);
        logs_copied = std::min(logs_copied + 100, logs_cnt);
    }

    assert(store1.next_slot() == store.next_slot());
    for (int i = 1; i <= logs_cnt; ++i)
    {
        ptr<log_entry> entry1 = store.entry_at((ulong)i);
        ptr<log_entry> entry2 = store1.entry_at((ulong)i);
        assert(entry_equals(*entry1, *entry2));
    }

    store.close();
    store1.close();
    cleanup();
    cleanup("tmp");
    rmdir("tmp");
}